

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O1

bool bssl::ext_supported_groups_add_clienthello
               (SSL_HANDSHAKE *hs,CBB *out,CBB *out_compressible,ssl_client_hello_type_t type)

{
  SSL *pSVar1;
  uint16_t uVar2;
  int iVar3;
  long lVar4;
  size_t sVar5;
  unsigned_short *puVar6;
  char cVar7;
  CBB groups_bytes;
  CBB contents;
  CBB local_90;
  CBB local_60;
  
  if ((hs->pake_prover)._M_t.
      super___uniq_ptr_impl<bssl::spake2plus::Prover,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_bssl::spake2plus::Prover_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bssl::spake2plus::Prover_*,_false>._M_head_impl != (Prover *)0x0) {
    return true;
  }
  pSVar1 = hs->ssl;
  iVar3 = CBB_add_u16(out_compressible,10);
  if (((iVar3 != 0) && (iVar3 = CBB_add_u16_length_prefixed(out_compressible,&local_60), iVar3 != 0)
      ) && (iVar3 = CBB_add_u16_length_prefixed(&local_60,&local_90), iVar3 != 0)) {
    if ((((pSVar1->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->field_0x288 & 0x20) != 0) {
      uVar2 = ssl_get_grease_value(hs,ssl_grease_group);
      iVar3 = CBB_add_u16(&local_90,uVar2);
      if (iVar3 == 0) {
        return false;
      }
    }
    sVar5 = (hs->config->supported_group_list).size_;
    if (sVar5 == 0) {
      puVar6 = &kDefaultGroups;
      sVar5 = 3;
    }
    else {
      puVar6 = (hs->config->supported_group_list).data_;
    }
    lVar4 = 0;
    while( true ) {
      uVar2 = *(uint16_t *)((long)puVar6 + lVar4);
      if (((uVar2 != 0x6399) && (uVar2 != 0x11ec)) || (cVar7 = '\x03', 0x303 < hs->max_version)) {
        iVar3 = CBB_add_u16(&local_90,uVar2);
        cVar7 = iVar3 == 0;
      }
      if ((cVar7 != '\x03') && (cVar7 != '\0')) break;
      lVar4 = lVar4 + 2;
      if (sVar5 * 2 == lVar4) {
        iVar3 = CBB_flush(out_compressible);
        return iVar3 != 0;
      }
    }
  }
  return false;
}

Assistant:

static bool ext_supported_groups_add_clienthello(const SSL_HANDSHAKE *hs,
                                                 CBB *out,
                                                 CBB *out_compressible,
                                                 ssl_client_hello_type_t type) {
  const SSL *const ssl = hs->ssl;
  // In PAKE mode, supported_groups and key_share are not used.
  if (hs->pake_prover != nullptr) {
    return true;
  }

  CBB contents, groups_bytes;
  if (!CBB_add_u16(out_compressible, TLSEXT_TYPE_supported_groups) ||
      !CBB_add_u16_length_prefixed(out_compressible, &contents) ||
      !CBB_add_u16_length_prefixed(&contents, &groups_bytes)) {
    return false;
  }

  // Add a fake group. See RFC 8701.
  if (ssl->ctx->grease_enabled &&
      !CBB_add_u16(&groups_bytes, ssl_get_grease_value(hs, ssl_grease_group))) {
    return false;
  }

  for (uint16_t group : tls1_get_grouplist(hs)) {
    if (is_post_quantum_group(group) && hs->max_version < TLS1_3_VERSION) {
      continue;
    }
    if (!CBB_add_u16(&groups_bytes, group)) {
      return false;
    }
  }

  return CBB_flush(out_compressible);
}